

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# responseproxy.cpp
# Opt level: O2

void int_trp_fatal(int line,char *file,char *format,...)

{
  char *file_00;
  char in_AL;
  bool bVar1;
  int iVar2;
  undefined8 in_RCX;
  undefined8 in_R8;
  undefined8 in_R9;
  size_t __maxlen;
  char *__s;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  undefined1 local_138 [24];
  undefined8 local_120;
  undefined8 local_118;
  undefined8 local_110;
  undefined8 local_108;
  undefined8 local_f8;
  undefined8 local_e8;
  undefined8 local_d8;
  undefined8 local_c8;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  string local_88;
  undefined8 local_68;
  va_list values;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_48;
  char *local_40;
  int local_38;
  allocator<char> local_31;
  
  __s = local_138;
  if (in_AL != '\0') {
    local_108 = in_XMM0_Qa;
    local_f8 = in_XMM1_Qa;
    local_e8 = in_XMM2_Qa;
    local_d8 = in_XMM3_Qa;
    local_c8 = in_XMM4_Qa;
    local_b8 = in_XMM5_Qa;
    local_a8 = in_XMM6_Qa;
    local_98 = in_XMM7_Qa;
  }
  __maxlen = 0x400;
  local_120 = in_RCX;
  local_118 = in_R8;
  local_110 = in_R9;
  local_40 = file;
  local_38 = line;
  do {
    __s = __s + -__maxlen;
    values[0].overflow_arg_area = local_138;
    values[0]._0_8_ = &stack0x00000008;
    local_68 = 0x3000000018;
    __s[-8] = -0x78;
    __s[-7] = '\f';
    __s[-6] = '\x11';
    __s[-5] = '\0';
    __s[-4] = '\0';
    __s[-3] = '\0';
    __s[-2] = '\0';
    __s[-1] = '\0';
    iVar2 = vsnprintf(__s,__maxlen,format,&local_68);
    if (iVar2 < 0) {
      __maxlen = (size_t)((int)__maxlen + 0x400);
    }
    __s[-8] = -0x62;
    __s[-7] = '\f';
    __s[-6] = '\x11';
    __s[-5] = '\0';
    __s[-4] = '\0';
    __s[-3] = '\0';
    __s[-2] = '\0';
    __s[-1] = '\0';
    bVar1 = IsMsgSizeOk((uint32_t)__maxlen);
  } while ((iVar2 < 0) && (bVar1));
  __s[-8] = -0x4d;
  __s[-7] = '\f';
  __s[-6] = '\x11';
  __s[-5] = '\0';
  __s[-4] = '\0';
  __s[-3] = '\0';
  __s[-2] = '\0';
  __s[-1] = '\0';
  trun::TestRunner::GetCurrentTestModule();
  __s[-8] = -0x3a;
  __s[-7] = '\f';
  __s[-6] = '\x11';
  __s[-5] = '\0';
  __s[-4] = '\0';
  __s[-3] = '\0';
  __s[-2] = '\0';
  __s[-1] = '\0';
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_88,__s,&local_31);
  iVar2 = local_38;
  file_00 = local_40;
  __s[-8] = -0x20;
  __s[-7] = '\f';
  __s[-6] = '\x11';
  __s[-5] = '\0';
  __s[-4] = '\0';
  __s[-3] = '\0';
  __s[-2] = '\0';
  __s[-1] = '\0';
  trun::TestResponseProxy::Fatal
            ((TestResponseProxy *)((long)values[0].reg_save_area + 0xa0),iVar2,file_00,&local_88);
  __s[-8] = -0x17;
  __s[-7] = '\f';
  __s[-6] = '\x11';
  __s[-5] = '\0';
  __s[-4] = '\0';
  __s[-3] = '\0';
  __s[-2] = '\0';
  __s[-1] = '\0';
  std::__cxx11::string::~string((string *)&local_88);
  __s[-8] = -0xe;
  __s[-7] = '\f';
  __s[-6] = '\x11';
  __s[-5] = '\0';
  __s[-4] = '\0';
  __s[-3] = '\0';
  __s[-2] = '\0';
  __s[-1] = '\0';
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_48);
  return;
}

Assistant:

static void int_trp_fatal(int line, const char *file, const char *format, ...) {
    CREATE_REPORT_STRING()
    TestRunner::GetCurrentTestModule()->GetTestResponseProxy().Fatal(line, file, std::string(newstr));
}